

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O0

void Rwr_ManWriteToFile(Rwr_Man_t *p,char *pFileName)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Rwr_Node_t *pRVar4;
  abctime aVar5;
  abctime clk;
  int nEntries;
  int i;
  uint *pBuffer;
  Rwr_Node_t *pNode;
  FILE *pFile;
  char *pFileName_local;
  Rwr_Man_t *p_local;
  
  pFile = (FILE *)pFileName;
  pFileName_local = (char *)p;
  aVar3 = Abc_Clock();
  clk._0_4_ = *(int *)(*(long *)(pFileName_local + 0x40) + 4) - 5;
  _nEntries = malloc((long)(int)((uint)clk * 2) << 2);
  for (clk._4_4_ = 0; clk._4_4_ < (int)(uint)clk; clk._4_4_ = clk._4_4_ + 1) {
    pBuffer = *(uint **)(*(long *)(*(long *)(pFileName_local + 0x40) + 8) +
                        (long)(clk._4_4_ + 5) * 8);
    pRVar4 = Rwr_Regular(*(Rwr_Node_t **)(pBuffer + 6));
    iVar1 = pRVar4->Id;
    uVar2 = Rwr_IsComplement(*(Rwr_Node_t **)(pBuffer + 6));
    *(uint *)((long)_nEntries + (long)(clk._4_4_ << 1) * 4) = iVar1 << 1 | uVar2;
    pRVar4 = Rwr_Regular(*(Rwr_Node_t **)(pBuffer + 8));
    iVar1 = pRVar4->Id;
    uVar2 = Rwr_IsComplement(*(Rwr_Node_t **)(pBuffer + 8));
    *(uint *)((long)_nEntries + (long)(clk._4_4_ * 2 + 1) * 4) = iVar1 << 1 | uVar2;
    *(uint *)((long)_nEntries + (long)(clk._4_4_ << 1) * 4) =
         *(int *)((long)_nEntries + (long)(clk._4_4_ << 1) * 4) << 1 |
         *(uint *)((long)pBuffer + 0xe) >> 0x1f;
  }
  pNode = (Rwr_Node_t *)fopen((char *)pFile,"wb");
  fwrite(&clk,4,1,(FILE *)pNode);
  fwrite(_nEntries,4,(long)(int)((uint)clk << 1),(FILE *)pNode);
  if (_nEntries != (void *)0x0) {
    free(_nEntries);
    _nEntries = (void *)0x0;
  }
  fclose((FILE *)pNode);
  printf("The number of nodes saved = %d.   ",(ulong)(uint)clk);
  Abc_Print(1,"%s =","Saving");
  aVar5 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
  return;
}

Assistant:

void Rwr_ManWriteToFile( Rwr_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Rwr_Node_t * pNode;
    unsigned * pBuffer;
    int i, nEntries;
    abctime clk = Abc_Clock();
    // prepare the buffer
    nEntries = p->vForest->nSize - 5;
    pBuffer = ABC_ALLOC( unsigned, nEntries * 2 );
    for ( i = 0; i < nEntries; i++ )
    {
        pNode = (Rwr_Node_t *)p->vForest->pArray[i+5];
        pBuffer[2*i + 0] = (Rwr_Regular(pNode->p0)->Id << 1) | Rwr_IsComplement(pNode->p0);
        pBuffer[2*i + 1] = (Rwr_Regular(pNode->p1)->Id << 1) | Rwr_IsComplement(pNode->p1);
        // save EXOR flag
        pBuffer[2*i + 0] = (pBuffer[2*i + 0] << 1) | pNode->fExor;

    }
    pFile = fopen( pFileName, "wb" );
    fwrite( &nEntries, sizeof(int), 1, pFile );
    fwrite( pBuffer, sizeof(unsigned), nEntries * 2, pFile );
    ABC_FREE( pBuffer );
    fclose( pFile );
    printf( "The number of nodes saved = %d.   ", nEntries );  ABC_PRT( "Saving", Abc_Clock() - clk );
}